

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ParallelBFS *this;
  NodeId *x;
  pointer piVar2;
  int i;
  long lVar3;
  double dVar4;
  environment env;
  allocator_type local_79;
  communicator world;
  shared_count local_70;
  int m;
  double global_elapsed;
  pointer local_58;
  double elapsed;
  pointer local_40;
  double local_30;
  int n;
  int argc_local;
  char **argv_local;
  
  argc_local = argc;
  argv_local = argv;
  boost::mpi::environment::environment(&env,&argc_local,&argv_local,true);
  boost::mpi::communicator::communicator(&world);
  iVar1 = boost::mpi::communicator::rank();
  if (iVar1 == 0) {
    __isoc99_scanf("%d %d",&n,&m);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&elapsed,(long)n,
               (allocator_type *)&global_elapsed);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&global_elapsed,(long)m,&local_79);
    for (; piVar2 = (pointer)global_elapsed, (pointer)elapsed != local_40;
        elapsed = (double)((long)elapsed + 4)) {
      __isoc99_scanf("%d",elapsed);
    }
    for (; piVar2 != local_58; piVar2 = piVar2 + 1) {
      __isoc99_scanf("%d",piVar2);
    }
    this = (ParallelBFS *)operator_new(0x68);
    ParallelBFS::ParallelBFS(this,&world,(NodeList *)&elapsed,(NodeList *)&global_elapsed);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&global_elapsed);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&elapsed);
  }
  else {
    this = (ParallelBFS *)operator_new(0x68);
    ParallelBFS::ParallelBFS(this,&world);
  }
  local_30 = (double)MPI_Wtime();
  ParallelBFS::calculate(this,0);
  dVar4 = (double)MPI_Wtime();
  elapsed = dVar4 - local_30;
  boost::mpi::reduce<double,boost::mpi::minimum<double>>(&world,&elapsed,&global_elapsed,0);
  iVar1 = boost::mpi::communicator::rank();
  if (iVar1 == 0) {
    fprintf(_stderr,"Running time: %lf s\n",global_elapsed);
  }
  for (lVar3 = 0; lVar3 < this->vertex_count; lVar3 = lVar3 + 1) {
    printf("%d: %d\n",(ulong)(uint)(this->first_vertex + (int)lVar3),
           (ulong)(uint)(this->distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar3]);
  }
  ParallelBFS::~ParallelBFS(this);
  operator_delete(this);
  boost::detail::shared_count::~shared_count(&local_70);
  boost::mpi::environment::~environment(&env);
  return 0;
}

Assistant:

int main(int argc, char *argv[1]) {
  mpi::environment env(argc, argv);
  mpi::communicator world;

  ParallelBFS *bfs;
  if (world.rank() == 0) {
    int n, m;
    scanf("%d %d", &n, &m);
    ParallelBFS::NodeList vertices((size_t)n), edges((size_t)m);
    for (ParallelBFS::NodeId &x : vertices)
      scanf("%d", &x);
    for (ParallelBFS::NodeId &x : edges)
      scanf("%d", &x);
    bfs = new ParallelBFS(world, vertices, edges);
  } else {
    bfs = new ParallelBFS(world);
  }

  mpi::timer timer;
  bfs->calculate(0);
  double elapsed = timer.elapsed(), global_elapsed;
  mpi::reduce(world, elapsed, global_elapsed, mpi::minimum<double>(), 0);
  if (world.rank() == 0)
    fprintf(stderr, "Running time: %lf s\n", global_elapsed);

  for (int i = 0; i < bfs->size(); ++i)
    printf("%d: %d\n", bfs->get_first_vertex() + i, bfs->get_distance(i));
  delete bfs;
  return 0;
}